

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::addColorBuffer
          (GLFrameBuffer *this,shared_ptr<polyscope::render::RenderBuffer> *renderBufferIn)

{
  int *piVar1;
  element_type *peVar2;
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<polyscope::render::RenderBuffer> local_28;
  
  peVar2 = (renderBufferIn->
           super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    peVar2 = (element_type *)0x0;
  }
  else {
    peVar2 = (element_type *)
             __dynamic_cast(peVar2,&RenderBuffer::typeinfo,&GLRenderBuffer::typeinfo,0);
  }
  if (peVar2 == (element_type *)0x0) {
    peVar2 = (element_type *)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = (renderBufferIn->
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  if (peVar2 != (element_type *)0x0) {
    (*(this->super_FrameBuffer)._vptr_FrameBuffer[2])(this);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    local_28.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar2;
    local_28.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_01;
    std::
    vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
    ::emplace_back<std::shared_ptr<polyscope::render::RenderBuffer>>
              ((vector<std::shared_ptr<polyscope::render::RenderBuffer>,std::allocator<std::shared_ptr<polyscope::render::RenderBuffer>>>
                *)&(this->super_FrameBuffer).renderBuffersColor,&local_28);
    if (local_28.super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.
                 super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    piVar1 = &(this->super_FrameBuffer).nColorBuffers;
    *piVar1 = *piVar1 + 1;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"tried to bind to non-GL render buffer");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void GLFrameBuffer::addColorBuffer(std::shared_ptr<RenderBuffer> renderBufferIn) {

  // it _better_ be a GL buffer
  std::shared_ptr<GLRenderBuffer> renderBuffer = std::dynamic_pointer_cast<GLRenderBuffer>(renderBufferIn);
  if (!renderBuffer) throw std::runtime_error("tried to bind to non-GL render buffer");

  renderBuffer->bind();
  bind();

  checkGLError();
  renderBuffersColor.push_back(renderBuffer);
  nColorBuffers++;
}